

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt1Bool32x4_1Int1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  OpCode opcode_00;
  RegOpnd *this_00;
  RegOpnd *this_01;
  RegOpnd *this_02;
  undefined4 *puVar4;
  Instr *instr_00;
  Instr *instr;
  OpCode opcode;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TySimd128B4);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
  this_01 = BuildSrcOpnd(this,src2RegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar3);
  this_02 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_02->super_Opnd,VVar3);
  opcode_00 = GetSimdOpcode(this,newOpcode);
  if (opcode_00 != Simd128_ExtractLane_B4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1924,"((opcode == Js::OpCode::Simd128_ExtractLane_B4))",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  instr_00 = IR::Instr::New(opcode_00,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd
                            ,this->m_func);
  AddInstr(this,instr_00,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Bool32x4_1Int1(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG3)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128B4);
    src1Opnd->SetValueType(ValueType::Simd);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt32);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    Js::OpCode opcode = GetSimdOpcode(newOpcode);

    AssertMsg((opcode == Js::OpCode::Simd128_ExtractLane_B4), "Unexpected opcode for this format.");

    IR::Instr * instr = IR::Instr::New(opcode, dstOpnd, src1Opnd, src2Opnd, m_func);
    AddInstr(instr, offset);
}